

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O1

void __thiscall
logging_tests::logging_LogPrintMacrosDeprecated::test_method(logging_LogPrintMacrosDeprecated *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  Logger *pLVar5;
  istream *piVar6;
  iterator pvVar7;
  iterator pvVar8;
  long *plVar9;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  const_string file_00;
  const_string msg;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  char *local_360;
  char *local_358;
  equal_coll_impl local_349;
  assertion_result local_348;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  string log;
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  long *local_258 [2];
  long local_248 [2];
  ifstream file;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar7 = (iterator)0x71;
  pvVar8 = (iterator)0xffffffffffffffff;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  source_file._M_len = 0x66;
  logging_function._M_str = "test_method";
  logging_function._M_len = 0xb;
  LogPrintFormatInternal<char[5]>
            (logging_function,source_file,0x71,ALL,Info,(ConstevalFormatString<1U>)0xea0a69,
             (char (*) [5])0xea0cf9);
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Trace);
  if (bVar3) {
    pvVar8 = (iterator)0x1;
    pvVar7 = (iterator)0x72;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_00._M_len = 0x66;
    logging_function_00._M_str = "test_method";
    logging_function_00._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_00,source_file_00,0x72,NET,Trace,(ConstevalFormatString<1U>)0xea0a73
               ,(char (*) [5])0xea09e5);
  }
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
  if (bVar3) {
    pvVar8 = (iterator)0x1;
    pvVar7 = (iterator)0x73;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_01._M_len = 0x66;
    logging_function_01._M_str = "test_method";
    logging_function_01._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_01,source_file_01,0x73,NET,Debug,(ConstevalFormatString<1U>)0xea0a7d
               ,(char (*) [5])0xea0d10);
  }
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Info);
  if (bVar3) {
    pvVar8 = (iterator)0x1;
    pvVar7 = (iterator)0x74;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_02._M_len = 0x66;
    logging_function_02._M_str = "test_method";
    logging_function_02._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_02,source_file_02,0x74,NET,Info,(ConstevalFormatString<1U>)0xea0a87,
               (char (*) [5])0xea0ac8);
  }
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Warning);
  if (bVar3) {
    pvVar8 = (iterator)0x1;
    pvVar7 = &DAT_00000075;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_03._M_len = 0x66;
    logging_function_03._M_str = "test_method";
    logging_function_03._M_len = 0xb;
    LogPrintFormatInternal<char[5]>
              (logging_function_03,source_file_03,0x75,NET,Warning,
               (ConstevalFormatString<1U>)0xea0a91,(char (*) [5])0xea0ae1);
  }
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Error);
  if (bVar3) {
    pvVar8 = (iterator)0x1;
    pvVar7 = (iterator)0x76;
    source_file_04._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
    ;
    source_file_04._M_len = 0x66;
    logging_function_04._M_str = "test_method";
    logging_function_04._M_len = 0xb;
    LogPrintFormatInternal<char[6]>
              (logging_function_04,source_file_04,0x76,NET,Error,(ConstevalFormatString<1U>)0xea0a9b
               ,(char (*) [6])0xea0af9);
  }
  std::ifstream::ifstream
            ((istream *)&file,
             (this->super_LogSetup).tmp_log_path.super_path._M_pathname._M_dataplus._M_p,_S_in);
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  log_lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &log.field_2;
  log._M_string_length = 0;
  log.field_2._M_allocated_capacity = log.field_2._M_allocated_capacity & 0xffffffffffffff00;
  log._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(_file + -0x18) + (char)(istream *)&file);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&log,cVar4);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&log_lines,&log);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)log._M_dataplus._M_p != paVar1) {
    operator_delete(log._M_dataplus._M_p,log.field_2._M_allocated_capacity + 1);
  }
  log._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&log,"foo5: bar5","");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"[net] foo7: bar7","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"[net:info] foo8: bar8","");
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"[net:warning] foo9: bar9","")
  ;
  plVar9 = local_248;
  local_258[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"[net:error] foo10: bar10","")
  ;
  __l._M_len = 5;
  __l._M_array = &log;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expected,__l,(allocator_type *)&local_348);
  lVar10 = -0xa0;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x83;
  file_00.m_begin = (iterator)&local_320;
  msg.m_end = pvVar8;
  msg.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_330,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_348,&local_349,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )log_lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )expected.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  log._M_string_length = log._M_string_length & 0xffffffffffffff00;
  log._M_dataplus._M_p = "@;\x1f";
  log.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  log.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/logging_tests.cpp"
  ;
  local_358 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_348,(lazy_ostream *)&log,1,0xd,4,0xea0a26,(size_t)&local_360,0x83,
             "log_lines.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_348.m_message.pn);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expected);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&log_lines);
  std::ifstream::~ifstream(&file);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_LogPrintMacrosDeprecated, LogSetup)
{
    LogPrintf("foo5: %s\n", "bar5");
    LogPrintLevel(BCLog::NET, BCLog::Level::Trace, "foo4: %s\n", "bar4"); // not logged
    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "foo7: %s\n", "bar7");
    LogPrintLevel(BCLog::NET, BCLog::Level::Info, "foo8: %s\n", "bar8");
    LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "foo9: %s\n", "bar9");
    LogPrintLevel(BCLog::NET, BCLog::Level::Error, "foo10: %s\n", "bar10");
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    std::vector<std::string> expected = {
        "foo5: bar5",
        "[net] foo7: bar7",
        "[net:info] foo8: bar8",
        "[net:warning] foo9: bar9",
        "[net:error] foo10: bar10",
    };
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}